

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

Heartbeat *
anon_unknown.dwarf_52c65e::createT11Heartbeat
          (Heartbeat *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  Heartbeat *extraout_RAX;
  FieldBase local_80;
  
  FIXT11::Heartbeat::Heartbeat(__return_storage_ptr__);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_80,9,iVar1);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_80,10,iVar1);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  return extraout_RAX;
}

Assistant:

FIXT11::Heartbeat createT11Heartbeat(const char *sender, const char *target, int seq) {
  FIXT11::Heartbeat heartbeat;
  fillHeader(heartbeat.getHeader(), sender, target, seq);
  heartbeat.getHeader().setField(BodyLength(heartbeat.bodyLength()));
  heartbeat.getTrailer().setField(CheckSum(heartbeat.checkSum()));
  return heartbeat;
}